

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  uint32_t *puVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  LRUHandle **ppLVar4;
  size_t *psVar5;
  long lVar6;
  LRUHandle *e;
  Mutex *this_00;
  LRUCache *this_01;
  LRUHandle *pLVar7;
  Slice local_40;
  
  lVar6 = 0;
  do {
    this_00 = &this->shard_[lVar6].mutex_;
    port::Mutex::Lock(this_00);
    pLVar7 = &this->shard_[lVar6].lru_;
    e = this->shard_[lVar6].lru_.next;
    if (e != pLVar7) {
      this_01 = this->shard_ + lVar6;
      do {
        pLVar2 = e->next;
        if (e->refs == 1) {
          if (pLVar2 == e) {
            local_40.data_ = *e->value;
            psVar5 = (size_t *)((long)e->value + 8);
          }
          else {
            local_40.data_ = e->key_data;
            psVar5 = &e->key_length;
          }
          local_40.size_ = *psVar5;
          ppLVar4 = HandleTable::FindPointer(&this_01->table_,&local_40,e->hash);
          if (*ppLVar4 != (LRUHandle *)0x0) {
            *ppLVar4 = (*ppLVar4)->next_hash;
            puVar1 = &(this_01->table_).elems_;
            *puVar1 = *puVar1 - 1;
          }
          pLVar3 = e->next;
          pLVar3->prev = e->prev;
          e->prev->next = pLVar3;
          LRUCache::Unref(this_01,e);
        }
        e = pLVar2;
      } while (pLVar2 != pLVar7);
    }
    port::Mutex::Unlock(this_00);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

virtual void Prune() {
                for (int s = 0; s < kNumShards; s++) {
                    shard_[s].Prune();
                }
            }